

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

NodeTranslator * __thiscall
kj::Arena::
allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
          (Arena *this,Node *params,ErrorReporter *params_1,Reader *params_2,
          Orphan<capnp::schema::Node> *params_3,bool *params_4)

{
  NodeTranslator *this_00;
  OrphanBuilder local_50;
  
  this_00 = (NodeTranslator *)allocateBytes(this,0xd8,8,true);
  local_50.segment = (params_3->builder).segment;
  local_50.capTable = (params_3->builder).capTable;
  local_50.location = (params_3->builder).location;
  local_50.tag.content = (params_3->builder).tag.content;
  (params_3->builder).segment = (SegmentBuilder *)0x0;
  (params_3->builder).location = (word *)0x0;
  capnp::compiler::NodeTranslator::NodeTranslator
            (this_00,&params->super_Resolver,params_1,params_2,
             (Orphan<capnp::schema::Node> *)&local_50,*params_4);
  if (local_50.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_50);
  }
  setDestructor(this,this_00,destroyObject<capnp::compiler::NodeTranslator>);
  return this_00;
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}